

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.hpp
# Opt level: O2

void __thiscall ylt::metric::summary_t::~summary_t(summary_t *this)

{
  (this->super_static_metric).super_metric_t._vptr_metric_t = (_func_int **)&PTR__summary_t_001e81d8
  ;
  detail::summary_impl<unsigned_long,_6UL>::~summary_impl(&this->impl_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->quantiles_).super__Vector_base<double,_std::allocator<double>_>);
  metric_t::~metric_t((metric_t *)this);
  return;
}

Assistant:

summary_t(std::string name, std::string help, std::vector<double> quantiles,
            std::chrono::seconds max_age = std::chrono::seconds{0})
      : static_metric(MetricType::Summary, std::move(name), std::move(help)),
        quantiles_(std::move(quantiles)),
        impl_(quantiles_,
              std::chrono::duration_cast<std::chrono::seconds>(max_age)) {
    if (!std::is_sorted(quantiles_.begin(), quantiles_.end()))
      std::sort(quantiles_.begin(), quantiles_.end());
  }